

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O3

int ps_config_validate(ps_config_t *config)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  lVar7 = 0;
  bVar1 = false;
  do {
    pcVar3 = ps_config_str(config,*(char **)((long)searches + lVar7));
    bVar2 = bVar1;
    if (pcVar3 != (char *)0x0) {
      bVar2 = true;
      if (bVar1) goto LAB_00106b4f;
    }
    bVar1 = bVar2;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x38);
  iVar6 = 0;
  if (true < bVar1) {
LAB_00106b4f:
    iVar6 = 0xc;
    lVar7 = 0;
    do {
      sVar4 = strlen(*(char **)((long)searches + lVar7));
      iVar5 = iVar6 + (int)sVar4;
      iVar6 = iVar5 + 2;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x38);
    pcVar3 = (char *)__ckd_malloc__((long)(iVar5 + 0x26),
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                    ,0x97);
    builtin_strncpy(pcVar3,"Only one of ",0xd);
    lVar7 = 0;
    do {
      strcat(pcVar3,*(char **)((long)searches + lVar7));
      sVar4 = strlen(pcVar3);
      (pcVar3 + sVar4)[0] = ',';
      (pcVar3 + sVar4)[1] = ' ';
      pcVar3[sVar4 + 2] = '\0';
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x38);
    sVar4 = strlen(pcVar3);
    builtin_strncpy(pcVar3 + sVar4,"can be enabled at a time in config\n",0x24);
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
            ,0x9e,pcVar3);
    ckd_free(pcVar3);
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

int
ps_config_validate(ps_config_t *config)
{
    int i, found = 0;
    for (i = 0; i < nsearches; ++i) {
        if (ps_config_str(config, searches[i]) != NULL)
            if (++found > 1)
                break;
    }
    if (found > 1) {
        int len = strlen("Only one of ");
        char *msg;
        for (i = 0; i < nsearches; ++i)
            len += strlen(searches[i]) + 2;
        len += strlen("can be enabled at a time in config\n");
        msg = ckd_malloc(len + 1);
        strcpy(msg, "Only one of ");
        for (i = 0; i < nsearches; ++i) {
            strcat(msg, searches[i]);
            strcat(msg, ", ");
        }
        strcat(msg, "can be enabled at a time in config\n");
        E_ERROR(msg);
        ckd_free(msg);
        return -1;
    }
    return 0;
}